

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::RemoveBlockRequest
          (PeerManagerImpl *this,uint256 *hash,optional<long> from_peer)

{
  size_t *psVar1;
  _Base_ptr p_Var2;
  long lVar3;
  CNodeState *pCVar4;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  __position;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  tVar5;
  _Self __tmp;
  BlockDownloadMap *this_00;
  char *in_R8;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar6;
  CNodeState *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->mapBlocksInFlight;
  pVar6 = std::
          multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
          ::equal_range(this_00,hash);
  __position = pVar6.first._M_node;
  if (__position._M_node != pVar6.second._M_node._M_node) {
    std::
    multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
    ::count(this_00,hash);
    while (__position._M_node != pVar6.second._M_node._M_node) {
      p_Var2 = __position._M_node[2]._M_parent;
      if ((((undefined1  [16])
            from_peer.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         (*(long *)(__position._M_node + 2) ==
          from_peer.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload)) {
        local_40 = State(this,*(long *)(__position._M_node + 2));
        inline_assertion_check<true,(anonymous_namespace)::CNodeState*>
                  (&local_40,(char *)0x52f,0x689847,"State(node_id)",in_R8);
        pCVar4 = local_40;
        if ((_Base_ptr)
            (local_40->vBlocksInFlight).
            super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
            ._M_impl._M_node.super__List_node_base._M_next == p_Var2) {
          tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                            ();
          lVar3 = (pCVar4->m_downloading_since).__r;
          if ((long)tVar5.__d.__r < lVar3) {
            tVar5.__d.__r = (duration)(duration)lVar3;
          }
          (pCVar4->m_downloading_since).__r = (rep)tVar5.__d.__r;
        }
        psVar1 = &(pCVar4->vBlocksInFlight).
                  super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        std::unique_ptr<PartiallyDownloadedBlock,_std::default_delete<PartiallyDownloadedBlock>_>::
        ~unique_ptr((unique_ptr<PartiallyDownloadedBlock,_std::default_delete<PartiallyDownloadedBlock>_>
                     *)&p_Var2->_M_right);
        operator_delete(p_Var2,0x20);
        if ((pCVar4->vBlocksInFlight).
            super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
            ._M_impl._M_node.super__List_node_base._M_next ==
            (_List_node_base *)&pCVar4->vBlocksInFlight) {
          this->m_peers_downloading_from = this->m_peers_downloading_from + -1;
        }
        (pCVar4->m_stalling_since).__r = 0;
        __position._M_node =
             (_Base_ptr)
             std::
             multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
             ::erase_abi_cxx11_((multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                                 *)this_00,__position._M_node);
      }
      else {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::RemoveBlockRequest(const uint256& hash, std::optional<NodeId> from_peer)
{
    auto range = mapBlocksInFlight.equal_range(hash);
    if (range.first == range.second) {
        // Block was not requested from any peer
        return;
    }

    // We should not have requested too many of this block
    Assume(mapBlocksInFlight.count(hash) <= MAX_CMPCTBLOCKS_INFLIGHT_PER_BLOCK);

    while (range.first != range.second) {
        auto [node_id, list_it] = range.first->second;

        if (from_peer && *from_peer != node_id) {
            range.first++;
            continue;
        }

        CNodeState& state = *Assert(State(node_id));

        if (state.vBlocksInFlight.begin() == list_it) {
            // First block on the queue was received, update the start download time for the next one
            state.m_downloading_since = std::max(state.m_downloading_since, GetTime<std::chrono::microseconds>());
        }
        state.vBlocksInFlight.erase(list_it);

        if (state.vBlocksInFlight.empty()) {
            // Last validated block on the queue for this peer was received.
            m_peers_downloading_from--;
        }
        state.m_stalling_since = 0us;

        range.first = mapBlocksInFlight.erase(range.first);
    }
}